

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O3

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream
          (cmGeneratedFileStream *this,string *name,bool quiet,Encoding encoding)

{
  undefined1 *puVar1;
  codecvt *this_00;
  char magic [3];
  locale lStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 *local_40;
  locale local_38;
  
  local_40 = &(this->super_ofstream).field_0x160;
  std::ios_base::ios_base((ios_base *)local_40);
  *(undefined **)&(this->super_ofstream).field_0x160 = &std::runtime_error::typeinfo;
  *(undefined8 *)&this->field_0x238 = 0;
  *(undefined2 *)&this->field_0x240 = 0;
  *(undefined8 *)&this->field_0x248 = 0;
  *(undefined8 *)&this->field_0x250 = 0;
  *(undefined8 *)&this->field_0x258 = 0;
  *(undefined8 *)&this->field_0x260 = 0;
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_008b51e0;
  *(undefined ***)&(this->super_ofstream).field_0x160 = &PTR__cmGeneratedFileStream_008b5208;
  std::ofstream::ofstream
            (this,(char *)&PTR_construction_vtable_24__008b5220,
             (_Ios_Openmode)*(undefined8 *)&(this->super_ofstream).field_0x138);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_008b51e0;
  *(undefined ***)&(this->super_ofstream).field_0x160 = &PTR__cmGeneratedFileStream_008b5208;
  if (((this->super_ofstream).field_0x180 & 5) != 0 && !quiet) {
    std::operator+(&local_60,"Cannot open file for write: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_ofstream).field_0x138);
    cmSystemTools::Error(&local_60);
    puVar1 = (undefined1 *)
             CONCAT53(local_60._M_dataplus._M_p._3_5_,
                      CONCAT12(local_60._M_dataplus._M_p._2_1_,local_60._M_dataplus._M_p._0_2_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 != &local_60.field_2) {
      operator_delete(puVar1,local_60.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::ReportLastSystemError("");
  }
  if (encoding != None) {
    std::locale::locale(&lStack_68,
                        (locale *)
                        (&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                          field_0xd0 +
                        (long)(this->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]));
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,encoding);
    std::locale::locale<codecvt>((locale *)&local_60,&lStack_68,this_00);
    std::ios::imbue(&local_38);
    std::locale::~locale(&local_38);
    std::locale::~locale((locale *)&local_60);
    std::locale::~locale(&lStack_68);
    if (encoding == UTF8_WITH_BOM) {
      local_60._M_dataplus._M_p._2_1_ = 0xbf;
      local_60._M_dataplus._M_p._0_2_ = 0xbbef;
      std::ostream::write((char *)this,(long)&local_60);
    }
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(std::string const& name,
                                             bool quiet, Encoding encoding)
  : cmGeneratedFileStreamBase(name)
  , Stream(this->TempName.c_str()) // NOLINT(cmake-use-cmsys-fstream)
{
  // Check if the file opened.
  if (!*this && !quiet) {
    cmSystemTools::Error("Cannot open file for write: " + this->TempName);
    cmSystemTools::ReportLastSystemError("");
  }
#ifndef CMAKE_BOOTSTRAP
  if (encoding != codecvt::None) {
    this->imbue(std::locale(this->getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
  if (encoding == codecvt::UTF8_WITH_BOM) {
    // Write the BOM encoding header into the file
    char magic[] = { static_cast<char>(0xEF), static_cast<char>(0xBB),
                     static_cast<char>(0xBF) };
    this->write(magic, 3);
  }
}